

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

ly_bool json_print_array_is_last_inst(jsonpr_ctx *pctx,lyd_node *node)

{
  uint32_t uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = (pctx->open).count;
  if (uVar1 != 0) {
    iVar2 = matching_node(node,(pctx->open).field_2.dnodes[uVar1 - 1]);
    if (iVar2 == 0) {
      bVar3 = false;
    }
    else if ((pctx->root != node) || (bVar3 = true, (pctx->options & 1) != 0)) {
      if (node->next == (lyd_node *)0x0) {
        bVar3 = true;
      }
      else {
        bVar3 = node->next->schema != node->schema;
      }
    }
    return bVar3;
  }
  return '\0';
}

Assistant:

static ly_bool
json_print_array_is_last_inst(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!is_open_array(pctx, node)) {
        /* no array open */
        return 0;
    }

    if ((pctx->root == node) && !(pctx->options & LYD_PRINT_WITHSIBLINGS)) {
        /* the only printed instance */
        return 1;
    }

    if (!node->next || (node->next->schema != node->schema)) {
        /* last instance */
        return 1;
    }

    return 0;
}